

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

bool getScriptFromDescriptor(string *descriptor,CScript *script,string *error)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pDVar5;
  long in_FS_OFFSET;
  value_type *desc;
  vector<CScript,_std::allocator<CScript>_> scripts;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  FlatSigningProvider provider;
  FlatSigningProvider key_provider;
  FlatSigningProvider *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  reference in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcd8;
  string *message;
  char *in_stack_fffffffffffffce0;
  char *func;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int line;
  FlatSigningProvider *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  bool local_293;
  string local_290 [2];
  char local_238 [312];
  undefined1 local_100 [248];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc98);
  Parse(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
        (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
        SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
  bVar1 = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   *)in_stack_fffffffffffffca8);
  if (bVar1) {
    local_293 = false;
  }
  else {
    sVar3 = std::
            vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    *)in_stack_fffffffffffffc98);
    if (1 < sVar3) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0,(allocator<char> *)in_stack_fffffffffffffcd8);
      JSONRPCError(in_stack_fffffffffffffcec,in_stack_fffffffffffffcd8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_013393c7;
    }
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          *)in_stack_fffffffffffffca8,CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0))
    ;
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_fffffffffffffc98);
    uVar2 = (*pDVar5->_vptr_Descriptor[2])();
    if ((uVar2 & 1) != 0) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0,(allocator<char> *)in_stack_fffffffffffffcd8);
      JSONRPCError(in_stack_fffffffffffffcec,in_stack_fffffffffffffcd8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_013393c7;
    }
    func = local_238;
    FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffc98);
    message = local_290;
    std::vector<CScript,_std::allocator<CScript>_>::vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
    pDVar5 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_fffffffffffffc98);
    uVar2 = (*pDVar5->_vptr_Descriptor[8])(pDVar5,0,local_100,message,func,0);
    line = CONCAT13((char)uVar2,(int3)in_stack_fffffffffffffcec);
    if ((uVar2 & 1) == 0) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(line,in_stack_fffffffffffffce8),func,(allocator<char> *)message);
      JSONRPCError(line,message);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_013393c7;
    }
    sVar3 = std::vector<CScript,_std::allocator<CScript>_>::size
                      ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
    if (sVar3 != 0) {
      std::vector<CScript,_std::allocator<CScript>_>::size
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
    }
    inline_check_non_fatal<bool>
              ((bool *)in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,line,func,
               (char *)message);
    sVar3 = std::vector<CScript,_std::allocator<CScript>_>::size
                      ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
    if (sVar3 == 1) {
      std::vector<CScript,_std::allocator<CScript>_>::at
                ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffca8,
                 CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
      CScript::operator=(in_stack_fffffffffffffca8,
                         (CScript *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    }
    else {
      sVar3 = std::vector<CScript,_std::allocator<CScript>_>::size
                        ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffc98);
      if (sVar3 == 4) {
        std::vector<CScript,_std::allocator<CScript>_>::at
                  ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffca8,
                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
        CScript::operator=(in_stack_fffffffffffffca8,
                           (CScript *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0))
        ;
      }
      else {
        in_stack_fffffffffffffca8 =
             std::vector<CScript,_std::allocator<CScript>_>::at
                       ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffca8,
                        CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
        CScript::operator=(in_stack_fffffffffffffca8,
                           (CScript *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0))
        ;
      }
    }
    local_293 = true;
    std::vector<CScript,_std::allocator<CScript>_>::~vector
              ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffca8);
    FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc98);
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             *)in_stack_fffffffffffffca8);
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffc98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_293;
  }
LAB_013393c7:
  __stack_chk_fail();
}

Assistant:

static bool getScriptFromDescriptor(const std::string& descriptor, CScript& script, std::string& error)
{
    FlatSigningProvider key_provider;
    const auto descs = Parse(descriptor, key_provider, error, /* require_checksum = */ false);
    if (descs.empty()) return false;
    if (descs.size() > 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Multipath descriptor not accepted");
    }
    const auto& desc = descs.at(0);
    if (desc->IsRange()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Ranged descriptor not accepted. Maybe pass through deriveaddresses first?");
    }

    FlatSigningProvider provider;
    std::vector<CScript> scripts;
    if (!desc->Expand(0, key_provider, scripts, provider)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
    }

    // Combo descriptors can have 2 or 4 scripts, so we can't just check scripts.size() == 1
    CHECK_NONFATAL(scripts.size() > 0 && scripts.size() <= 4);

    if (scripts.size() == 1) {
        script = scripts.at(0);
    } else if (scripts.size() == 4) {
        // For uncompressed keys, take the 3rd script, since it is p2wpkh
        script = scripts.at(2);
    } else {
        // Else take the 2nd script, since it is p2pkh
        script = scripts.at(1);
    }

    return true;
}